

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.hpp
# Opt level: O2

descriptor_state * __thiscall
boost::asio::detail::object_pool<boost::asio::detail::epoll_reactor::descriptor_state>::alloc<bool>
          (object_pool<boost::asio::detail::epoll_reactor::descriptor_state> *this,bool arg)

{
  descriptor_state *pdVar1;
  
  pdVar1 = this->free_list_;
  if (pdVar1 == (descriptor_state *)0x0) {
    pdVar1 = object_pool_access::create<boost::asio::detail::epoll_reactor::descriptor_state,bool>
                       (arg);
  }
  else {
    this->free_list_ = pdVar1->next_;
  }
  pdVar1->next_ = this->live_list_;
  pdVar1->prev_ = (descriptor_state *)0x0;
  if (this->live_list_ != (descriptor_state *)0x0) {
    this->live_list_->prev_ = pdVar1;
  }
  this->live_list_ = pdVar1;
  return pdVar1;
}

Assistant:

Object* alloc(Arg arg)
  {
    Object* o = free_list_;
    if (o)
      free_list_ = object_pool_access::next(free_list_);
    else
      o = object_pool_access::create<Object>(arg);

    object_pool_access::next(o) = live_list_;
    object_pool_access::prev(o) = 0;
    if (live_list_)
      object_pool_access::prev(live_list_) = o;
    live_list_ = o;

    return o;
  }